

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

bool spirv_cross::CompilerGLSL::is_supported_subgroup_op_in_opengl(Op op,uint32_t *ops)

{
  if (0xb < op - OpGroupNonUniformElect) {
    if (op - OpGroupNonUniformIAdd < 4) {
      return ops[3] < 3;
    }
    if (1 < op - OpControlBarrier) {
      return false;
    }
  }
  return true;
}

Assistant:

bool CompilerGLSL::is_supported_subgroup_op_in_opengl(spv::Op op, const uint32_t *ops)
{
	switch (op)
	{
	case OpGroupNonUniformElect:
	case OpGroupNonUniformBallot:
	case OpGroupNonUniformBallotFindLSB:
	case OpGroupNonUniformBallotFindMSB:
	case OpGroupNonUniformBroadcast:
	case OpGroupNonUniformBroadcastFirst:
	case OpGroupNonUniformAll:
	case OpGroupNonUniformAny:
	case OpGroupNonUniformAllEqual:
	case OpControlBarrier:
	case OpMemoryBarrier:
	case OpGroupNonUniformBallotBitCount:
	case OpGroupNonUniformBallotBitExtract:
	case OpGroupNonUniformInverseBallot:
		return true;
	case OpGroupNonUniformIAdd:
	case OpGroupNonUniformFAdd:
	case OpGroupNonUniformIMul:
	case OpGroupNonUniformFMul:
	{
		const GroupOperation operation = static_cast<GroupOperation>(ops[3]);
		if (operation == GroupOperationReduce || operation == GroupOperationInclusiveScan ||
		    operation == GroupOperationExclusiveScan)
		{
			return true;
		}
		else
		{
			return false;
		}
	}
	default:
		return false;
	}
}